

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::internal::BoundedZCIS>
          (MessageLite *this,BoundedZCIS *input)

{
  bool bVar1;
  MessageLite *in_RDI;
  bool res;
  bool alias;
  MessageLite *in_stack_00000038;
  undefined1 in_stack_00000040 [16];
  bool local_29;
  
  (*in_RDI->_vptr_MessageLite[7])();
  bVar1 = internal::MergePartialFromImpl<false>((BoundedZCIS)in_stack_00000040,in_stack_00000038);
  local_29 = false;
  if (bVar1) {
    local_29 = IsInitializedWithErrors(in_RDI);
  }
  return local_29;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}